

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

bool tcu::bilinearCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,RGBA threshold,CompareLogMode logMode)

{
  byte bVar1;
  size_t result_00;
  bool bVar2;
  int width;
  int height;
  TextureFormat *pTVar3;
  MessageBuilder *pMVar4;
  TestLog *pTVar5;
  bool local_762;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  LogImage local_6d8;
  allocator<char> local_641;
  string local_640;
  allocator<char> local_619;
  string local_618;
  LogImageSet local_5f8;
  TextureFormat local_5b8;
  ConstPixelBufferAccess local_5b0;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  LogImage local_538;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  LogImage local_458;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  LogImage local_378;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  LogImageSet local_298;
  MessageBuilder local_258;
  TextureFormat local_d8;
  TextureFormat local_d0;
  undefined1 local_c8 [8];
  Vec4 pixelScale;
  Vec4 pixelBias;
  PixelBufferAccess local_98;
  byte local_69;
  bool isOk;
  undefined1 local_60 [8];
  TextureLevel errorMask;
  ConstPixelBufferAccess *result_local;
  ConstPixelBufferAccess *reference_local;
  char *imageSetDesc_local;
  char *imageSetName_local;
  TestLog *log_local;
  RGBA threshold_local;
  
  errorMask.m_data.m_cap = (size_t)result;
  log_local._4_4_ = threshold.m_value;
  TextureFormat::TextureFormat((TextureFormat *)&stack0xffffffffffffff98,RGB,UNORM_INT8);
  width = ConstPixelBufferAccess::getWidth(reference);
  height = ConstPixelBufferAccess::getHeight(reference);
  TextureLevel::TextureLevel
            ((TextureLevel *)local_60,(TextureFormat *)&stack0xffffffffffffff98,width,height,1);
  result_00 = errorMask.m_data.m_cap;
  PixelBufferAccess::PixelBufferAccess(&local_98,(TextureLevel *)local_60);
  local_69 = bilinearCompare(reference,(ConstPixelBufferAccess *)result_00,&local_98,log_local._4_4_
                            );
  Vector<float,_4>::Vector((Vector<float,_4> *)(pixelScale.m_data + 2),0.0,0.0,0.0,0.0);
  Vector<float,_4>::Vector((Vector<float,_4> *)local_c8,1.0,1.0,1.0,1.0);
  if (((local_69 & 1) == 0) || (logMode == COMPARE_LOG_EVERYTHING)) {
    pTVar3 = ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)errorMask.m_data.m_cap);
    TextureFormat::TextureFormat(&local_d0,RGBA,UNORM_INT8);
    bVar2 = TextureFormat::operator!=(pTVar3,&local_d0);
    local_762 = false;
    if (bVar2) {
      pTVar3 = ConstPixelBufferAccess::getFormat(reference);
      TextureFormat::TextureFormat(&local_d8,RGBA,UNORM_INT8);
      local_762 = TextureFormat::operator!=(pTVar3,&local_d8);
    }
    if (local_762 != false) {
      anon_unknown_47::computeScaleAndBias
                (reference,(ConstPixelBufferAccess *)errorMask.m_data.m_cap,(Vec4 *)local_c8,
                 (Vec4 *)(pixelScale.m_data + 2));
    }
    if ((local_69 & 1) == 0) {
      TestLog::operator<<(&local_258,log,(BeginMessageToken *)&TestLog::Message);
      pMVar4 = MessageBuilder::operator<<
                         (&local_258,(char (*) [38])"Image comparison failed, threshold = ");
      pMVar4 = MessageBuilder::operator<<(pMVar4,(RGBA *)((long)&log_local + 4));
      MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&TestLog::EndMessage);
      MessageBuilder::~MessageBuilder(&local_258);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,imageSetName,&local_2b9)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,imageSetDesc,&local_2e1)
    ;
    LogImageSet::LogImageSet(&local_298,&local_2b8,&local_2e0);
    pTVar5 = TestLog::operator<<(log,&local_298);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"Result",&local_399);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"Result",&local_3c1);
    LogImage::LogImage(&local_378,&local_398,&local_3c0,
                       (ConstPixelBufferAccess *)errorMask.m_data.m_cap,(Vec4 *)local_c8,
                       (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar5 = TestLog::operator<<(pTVar5,&local_378);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"Reference",&local_479);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"Reference",&local_4a1);
    LogImage::LogImage(&local_458,&local_478,&local_4a0,reference,(Vec4 *)local_c8,
                       (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar5 = TestLog::operator<<(pTVar5,&local_458);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"ErrorMask",&local_559);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,"Error mask",&local_581)
    ;
    ConstPixelBufferAccess::ConstPixelBufferAccess(&local_5b0,(TextureLevel *)local_60);
    LogImage::LogImage(&local_538,&local_558,&local_580,&local_5b0,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar5 = TestLog::operator<<(pTVar5,&local_538);
    TestLog::operator<<(pTVar5,(EndImageSetToken *)&TestLog::EndImageSet);
    LogImage::~LogImage(&local_538);
    std::__cxx11::string::~string((string *)&local_580);
    std::allocator<char>::~allocator(&local_581);
    std::__cxx11::string::~string((string *)&local_558);
    std::allocator<char>::~allocator(&local_559);
    LogImage::~LogImage(&local_458);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator(&local_4a1);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator(&local_479);
    LogImage::~LogImage(&local_378);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator(&local_3c1);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator(&local_399);
    LogImageSet::~LogImageSet(&local_298);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
  }
  else if (logMode == COMPARE_LOG_RESULT) {
    pTVar3 = ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)errorMask.m_data.m_cap);
    TextureFormat::TextureFormat(&local_5b8,RGBA,UNORM_INT8);
    bVar2 = TextureFormat::operator!=(pTVar3,&local_5b8);
    if (bVar2) {
      computePixelScaleBias
                ((ConstPixelBufferAccess *)errorMask.m_data.m_cap,(Vec4 *)local_c8,
                 (Vec4 *)(pixelScale.m_data + 2));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,imageSetName,&local_619)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,imageSetDesc,&local_641)
    ;
    LogImageSet::LogImageSet(&local_5f8,&local_618,&local_640);
    pTVar5 = TestLog::operator<<(log,&local_5f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"Result",&local_6f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"Result",&local_721);
    LogImage::LogImage(&local_6d8,&local_6f8,&local_720,
                       (ConstPixelBufferAccess *)errorMask.m_data.m_cap,(Vec4 *)local_c8,
                       (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar5 = TestLog::operator<<(pTVar5,&local_6d8);
    TestLog::operator<<(pTVar5,(EndImageSetToken *)&TestLog::EndImageSet);
    LogImage::~LogImage(&local_6d8);
    std::__cxx11::string::~string((string *)&local_720);
    std::allocator<char>::~allocator(&local_721);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::allocator<char>::~allocator(&local_6f9);
    LogImageSet::~LogImageSet(&local_5f8);
    std::__cxx11::string::~string((string *)&local_640);
    std::allocator<char>::~allocator(&local_641);
    std::__cxx11::string::~string((string *)&local_618);
    std::allocator<char>::~allocator(&local_619);
  }
  bVar1 = local_69;
  TextureLevel::~TextureLevel((TextureLevel *)local_60);
  return (bool)(bVar1 & 1);
}

Assistant:

bool bilinearCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const RGBA threshold, CompareLogMode logMode)
{
	TextureLevel		errorMask		(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), reference.getWidth(), reference.getHeight());
	bool				isOk			= bilinearCompare(reference, result, errorMask, threshold);
	Vec4				pixelBias		(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale		(1.0f, 1.0f, 1.0f, 1.0f);

	if (!isOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8) && reference.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computeScaleAndBias(reference, result, pixelScale, pixelBias);

		if (!isOk)
			log << TestLog::Message << "Image comparison failed, threshold = " << threshold << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result, pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return isOk;
}